

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O2

int xercesc_4_0::Base64::getDataLength(XMLCh *inputData,MemoryManager *manager,Conformance conform)

{
  XMLByte *buffer;
  XMLSize_t retLen;
  
  retLen = 0;
  buffer = decodeToXMLByte(inputData,&retLen,manager,conform);
  if (buffer == (XMLByte *)0x0) {
    retLen._0_4_ = -1;
  }
  else {
    returnExternalMemory(manager,buffer);
  }
  return (int)retLen;
}

Assistant:

int Base64::getDataLength(const XMLCh*         const inputData
                        ,       MemoryManager* const manager
                        ,       Conformance          conform )

{
    XMLSize_t retLen = 0;
    XMLByte* decodedData = decodeToXMLByte(inputData, &retLen, manager, conform);

    if ( !decodedData )
        return -1;
    else
    {
        returnExternalMemory(manager, decodedData);
        return (int)retLen;
    }
}